

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

int mp3dec_decode_frame(mp3dec_t *dec,uint8_t *mp3,int mp3_bytes,mp3d_sample_t *pcm,
                       mp3dec_frame_info_t *info)

{
  int iVar1;
  uint uVar2;
  long in_RCX;
  int in_EDX;
  uint8_t *in_RSI;
  mp3dec_t *in_RDI;
  int *in_R8;
  L12_scale_info sci [1];
  int main_data_begin;
  mp3dec_scratch_t scratch;
  bs_t bs_frame [1];
  uint8_t *hdr;
  int success;
  int frame_size;
  int igr;
  int i;
  mp3dec_scratch_t *in_stack_ffffffffffffbc88;
  undefined4 in_stack_ffffffffffffbc90;
  int in_stack_ffffffffffffbc94;
  undefined4 in_stack_ffffffffffffbc98;
  int in_stack_ffffffffffffbc9c;
  int in_stack_ffffffffffffbca0;
  int in_stack_ffffffffffffbca4;
  undefined4 in_stack_ffffffffffffbca8;
  int in_stack_ffffffffffffbcac;
  mp3dec_t *in_stack_ffffffffffffbcb0;
  undefined4 in_stack_ffffffffffffbcb8;
  int in_stack_ffffffffffffbcbc;
  undefined4 in_stack_ffffffffffffbcc0;
  int in_stack_ffffffffffffbcc4;
  bs_t *in_stack_ffffffffffffbcc8;
  mp3dec_t *in_stack_ffffffffffffbcd0;
  bs_t *in_stack_ffffffffffffbcd8;
  uint8_t *in_stack_ffffffffffffbce0;
  undefined1 auStack_3448 [13296];
  bs_t local_58;
  uint8_t *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int *local_30;
  long local_28;
  int local_1c;
  uint8_t *local_18;
  mp3dec_t *local_10;
  uint local_4;
  
  local_34 = 0;
  local_3c = 0;
  local_40 = 1;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (((4 < in_EDX) && (in_RDI->header[0] == 0xff)) &&
     (iVar1 = hdr_compare((uint8_t *)CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90),
                          (uint8_t *)in_stack_ffffffffffffbc88), iVar1 != 0)) {
    in_stack_ffffffffffffbc94 =
         hdr_frame_bytes((uint8_t *)CONCAT44(in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0),
                         in_stack_ffffffffffffbc9c);
    local_3c = hdr_padding(local_18);
    local_3c = in_stack_ffffffffffffbc94 + local_3c;
    if ((local_3c != local_1c) &&
       ((local_1c < local_3c + 4 ||
        (iVar1 = hdr_compare((uint8_t *)
                             CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90),
                             (uint8_t *)in_stack_ffffffffffffbc88), iVar1 == 0)))) {
      local_3c = 0;
    }
  }
  if (local_3c == 0) {
    memset(local_10,0,0x1a0c);
    local_34 = mp3d_find_frame((uint8_t *)in_stack_ffffffffffffbcc8,in_stack_ffffffffffffbcc4,
                               (int *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
                               (int *)in_stack_ffffffffffffbcb0);
    if ((local_3c == 0) || (local_1c < local_34 + local_3c)) {
      *local_30 = local_34;
      return 0;
    }
  }
  local_48 = local_18 + local_34;
  *(undefined4 *)local_10->header = *(undefined4 *)local_48;
  *local_30 = local_34 + local_3c;
  local_30[1] = local_34;
  iVar1 = 2;
  if ((local_48[3] & 0xc0) == 0xc0) {
    iVar1 = 1;
  }
  local_30[2] = iVar1;
  uVar2 = hdr_sample_rate_hz(local_48);
  local_30[3] = uVar2;
  local_30[4] = 4 - ((int)(uint)local_48[1] >> 1 & 3U);
  uVar2 = hdr_bitrate_kbps(local_48);
  local_30[5] = uVar2;
  if (local_28 == 0) {
    local_4 = hdr_frame_samples(local_48);
  }
  else {
    bs_init(&local_58,local_48 + 4,local_3c + -4);
    if ((local_48[1] & 1) == 0) {
      get_bits(&local_58,0x10);
    }
    if (local_30[4] == 3) {
      iVar1 = L3_read_side_info((bs_t *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8
                                                ),(L3_gr_info_t *)in_stack_ffffffffffffbcb0,
                                (uint8_t *)
                                CONCAT44(in_stack_ffffffffffffbcac,in_stack_ffffffffffffbca8));
      if ((iVar1 < 0) || (local_58.limit < local_58.pos)) {
        mp3dec_init(local_10);
        return 0;
      }
      local_40 = L3_restore_reservoir
                           (in_stack_ffffffffffffbcd0,in_stack_ffffffffffffbcc8,
                            (mp3dec_scratch_t *)
                            CONCAT44(in_stack_ffffffffffffbcc4,in_stack_ffffffffffffbcc0),
                            in_stack_ffffffffffffbcbc);
      if (local_40 != 0) {
        local_38 = 0;
        while( true ) {
          iVar1 = 1;
          if ((local_48[1] & 8) != 0) {
            iVar1 = 2;
          }
          if (iVar1 <= local_38) break;
          memset(auStack_3448,0,0x1200);
          L3_decode(in_stack_ffffffffffffbcb0,
                    (mp3dec_scratch_t *)
                    CONCAT44(in_stack_ffffffffffffbcac,in_stack_ffffffffffffbca8),
                    (L3_gr_info_t *)CONCAT44(in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0),
                    in_stack_ffffffffffffbc9c);
          mp3d_synth_granule((float *)in_stack_ffffffffffffbcb0,
                             (float *)CONCAT44(in_stack_ffffffffffffbcac,in_stack_ffffffffffffbca8),
                             in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0,
                             (mp3d_sample_t *)
                             CONCAT44(in_stack_ffffffffffffbc9c,in_stack_ffffffffffffbc98),
                             (float *)CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90))
          ;
          local_38 = local_38 + 1;
          local_28 = local_28 + (long)(local_30[2] * 0x240) * 2;
        }
      }
      L3_save_reservoir((mp3dec_t *)CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90),
                        in_stack_ffffffffffffbc88);
    }
    else {
      L12_read_scale_info(in_stack_ffffffffffffbce0,in_stack_ffffffffffffbcd8,
                          (L12_scale_info *)in_stack_ffffffffffffbcd0);
      memset(auStack_3448,0,0x1200);
      local_34 = 0;
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        iVar1 = L12_dequantize_granule
                          ((float *)CONCAT44(in_stack_ffffffffffffbcc4,in_stack_ffffffffffffbcc0),
                           (bs_t *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
                           (L12_scale_info *)in_stack_ffffffffffffbcb0,in_stack_ffffffffffffbcac);
        local_34 = iVar1 + local_34;
        if (local_34 == 0xc) {
          local_34 = 0;
          L12_apply_scf_384((L12_scale_info *)
                            CONCAT44(in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0),
                            (float *)CONCAT44(in_stack_ffffffffffffbc9c,in_stack_ffffffffffffbc98),
                            (float *)CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90));
          mp3d_synth_granule((float *)in_stack_ffffffffffffbcb0,
                             (float *)CONCAT44(in_stack_ffffffffffffbcac,in_stack_ffffffffffffbca8),
                             in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0,
                             (mp3d_sample_t *)
                             CONCAT44(in_stack_ffffffffffffbc9c,in_stack_ffffffffffffbc98),
                             (float *)CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90))
          ;
          memset(auStack_3448,0,0x1200);
          local_28 = local_28 + (long)(local_30[2] * 0x180) * 2;
        }
        if (local_58.limit < local_58.pos) {
          mp3dec_init(local_10);
          return 0;
        }
      }
    }
    local_4 = hdr_frame_samples(local_10->header);
    local_4 = local_40 * local_4;
  }
  return local_4;
}

Assistant:

int mp3dec_decode_frame(mp3dec_t *dec, const uint8_t *mp3, int mp3_bytes, mp3d_sample_t *pcm, mp3dec_frame_info_t *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const uint8_t *hdr;
    bs_t bs_frame[1];
    mp3dec_scratch_t scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && hdr_compare(dec->header, mp3))
    {
        frame_size = hdr_frame_bytes(mp3, dec->free_format_bytes) + hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + HDR_SIZE > mp3_bytes || !hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(mp3dec_t));
        i = mp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->frame_offset = i;
    info->channels = HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = hdr_sample_rate_hz(hdr);
    info->layer = 4 - HDR_GET_LAYER(hdr);
    info->bitrate_kbps = hdr_bitrate_kbps(hdr);

    if (!pcm)
    {
        return hdr_frame_samples(hdr);
    }

    bs_init(bs_frame, hdr + HDR_SIZE, frame_size - HDR_SIZE);
    if (HDR_IS_CRC(hdr))
    {
        get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            mp3dec_init(dec);
            return 0;
        }
        success = L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success)
        {
            for (igr = 0; igr < (HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm += 576*info->channels)
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, pcm, scratch.syn[0]);
            }
        }
        L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef MINIMP3_ONLY_MP3
        return 0;
#else /* MINIMP3_ONLY_MP3 */
        L12_scale_info sci[1];
        L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm += 384*info->channels;
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                mp3dec_init(dec);
                return 0;
            }
        }
#endif /* MINIMP3_ONLY_MP3 */
    }
    return success*hdr_frame_samples(dec->header);
}